

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O3

void test_dual_storage_with_tuple_copy_ctor(void)

{
  DateInterval_move_ctor_calls_count = 0;
  DateInterval_value_ctor_calls_count = 1;
  DateInterval_copy_ctor_calls_count = 1;
  DateInterval_dtor_calls_count = 2;
  return;
}

Assistant:

void test_dual_storage_with_tuple_copy_ctor()
{
  reset_Interval_count();
  {
    typedef markable<mark_interval> opt_interval;
    DateInterval i12 {Date{1}, Date{2}};
    assert (count_Interval_value_copy_move_dtror(1, 0, 0, 0));

    opt_interval o2 {i12};
    assert (o2.has_value());
    assert (o2.value() == i12);
    assert (count_Interval_value_copy_move_dtror(1, 1, 0, 0));
  }
  assert (count_Interval_value_copy_move_dtror(1, 1, 0, 2));
}